

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall
caffe::LRNParameter::SerializeWithCachedSizes(LRNParameter *this,CodedOutputStream *output)

{
  uint uVar1;
  uint32 value;
  LRNParameter_NormRegion value_00;
  LRNParameter_Engine value_01;
  UnknownFieldSet *unknown_fields;
  float fVar2;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  LRNParameter *this_local;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 4) != 0) {
    value = local_size(this);
    google::protobuf::internal::WireFormatLite::WriteUInt32(1,value,output);
  }
  if ((uVar1 & 8) != 0) {
    fVar2 = alpha(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(2,fVar2,output);
  }
  if ((uVar1 & 0x10) != 0) {
    fVar2 = beta(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(3,fVar2,output);
  }
  if ((uVar1 & 1) != 0) {
    value_00 = norm_region(this);
    google::protobuf::internal::WireFormatLite::WriteEnum(4,value_00,output);
  }
  if ((uVar1 & 0x20) != 0) {
    fVar2 = k(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(5,fVar2,output);
  }
  if ((uVar1 & 2) != 0) {
    value_01 = engine(this);
    google::protobuf::internal::WireFormatLite::WriteEnum(6,value_01,output);
  }
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = LRNParameter::unknown_fields(this);
    google::protobuf::internal::WireFormat::SerializeUnknownFields(unknown_fields,output);
  }
  return;
}

Assistant:

void LRNParameter::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:caffe.LRNParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional uint32 local_size = 1 [default = 5];
  if (cached_has_bits & 0x00000004u) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(1, this->local_size(), output);
  }

  // optional float alpha = 2 [default = 1];
  if (cached_has_bits & 0x00000008u) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(2, this->alpha(), output);
  }

  // optional float beta = 3 [default = 0.75];
  if (cached_has_bits & 0x00000010u) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(3, this->beta(), output);
  }

  // optional .caffe.LRNParameter.NormRegion norm_region = 4 [default = ACROSS_CHANNELS];
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      4, this->norm_region(), output);
  }

  // optional float k = 5 [default = 1];
  if (cached_has_bits & 0x00000020u) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(5, this->k(), output);
  }

  // optional .caffe.LRNParameter.Engine engine = 6 [default = DEFAULT];
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      6, this->engine(), output);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
  // @@protoc_insertion_point(serialize_end:caffe.LRNParameter)
}